

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O2

void ubidi_addPropertyStarts_63(USetAdder *sa,UErrorCode *pErrorCode)

{
  uint8_t uVar1;
  bool bVar2;
  uint8_t uVar3;
  uint uVar4;
  uint8_t *puVar5;
  uint uVar6;
  long lVar7;
  bool bVar8;
  
  if (U_ZERO_ERROR < *pErrorCode) {
    return;
  }
  utrie2_enum_63(&ubidi_props_singleton.trie,(UTrie2EnumValue *)0x0,_enumPropertyStartsRange,sa);
  for (lVar7 = 0; lVar7 != 0xa0; lVar7 = lVar7 + 4) {
    uVar4 = *(uint *)((long)ubidi_props_mirrors + lVar7) & 0x1fffff;
    (*(code *)sa->addRange)(sa->set,uVar4,uVar4 + 1);
  }
  puVar5 = "-";
  uVar4 = 0x8c0;
  uVar6 = 0x620;
  bVar2 = true;
  do {
    bVar8 = bVar2;
    uVar3 = '\0';
    for (; uVar6 < uVar4; uVar6 = uVar6 + 1) {
      uVar1 = *puVar5;
      if (uVar1 != uVar3) {
        (*(code *)sa->add)(sa->set,uVar6);
        uVar3 = uVar1;
      }
      puVar5 = puVar5 + 1;
    }
    if (uVar3 != '\0') {
      (*(code *)sa->add)(sa->set,uVar4);
    }
    uVar4 = 0x10d24;
    uVar6 = 0x10ac0;
    puVar5 = ":<<@@=";
    bVar2 = false;
  } while (bVar8);
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }